

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O1

Int __thiscall ipx::ForrestTomlin::_Update(ForrestTomlin *this,double pivot)

{
  int iVar1;
  int *piVar2;
  pointer piVar3;
  pointer pdVar4;
  iterator __position;
  Int IVar5;
  ostream *poVar6;
  Int q1;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  fmtflags floatfield;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  char local_89;
  double local_88;
  undefined8 uStack_80;
  double local_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  string local_50;
  
  piVar2 = (this->U_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (ulong)((long)(this->U_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >> 2;
  uVar10 = 0;
  uVar7 = (uint)uVar8;
  bVar17 = 0 < (int)uVar7;
  if ((0 < (int)uVar7) && (*piVar2 != this->replace_next_)) {
    uVar12 = (ulong)(uVar7 & 0x7fffffff);
    uVar13 = 0;
    do {
      if (uVar12 - 1 == uVar13) {
        bVar17 = uVar13 + 1 < uVar12;
        uVar10 = uVar8 & 0xffffffff;
        goto LAB_0039d0b6;
      }
      uVar10 = uVar13 + 1;
      lVar14 = uVar13 + 1;
      uVar13 = uVar10;
    } while (piVar2[lVar14] != this->replace_next_);
    bVar17 = uVar10 < uVar12;
  }
LAB_0039d0b6:
  local_58 = 0.0;
  local_70 = 0.0;
  uVar9 = (uint)uVar10;
  if (uVar9 != uVar7) {
    local_70 = (this->U_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10 & 0xffffffff];
  }
  lVar14 = (long)(this->U_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)this->replace_next_ + 1];
  local_68 = (double)CONCAT71(local_68._1_7_,bVar17);
  if (0 < (int)uVar7) {
    piVar3 = (this->R_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar15 = (int)((ulong)((long)(this->R_).rowidx_queue_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
    if (0 < iVar15) {
      iVar11 = 0;
      iVar16 = 0;
      do {
        iVar1 = piVar3[iVar16];
        if (piVar2[iVar11] == iVar1) {
          local_58 = local_58 +
                     (this->U_).values_queue_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar11] *
                     (this->R_).values_queue_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar16];
          iVar11 = iVar11 + 1;
LAB_0039d165:
          iVar16 = iVar16 + 1;
        }
        else {
          if (iVar1 <= piVar2[iVar11]) goto LAB_0039d165;
          iVar11 = iVar11 + 1;
        }
      } while ((iVar11 < (int)uVar7) && (iVar16 < iVar15));
    }
  }
  local_88 = pivot * (this->U_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar14 + -1];
  iVar15 = (int)((ulong)((long)(this->replaced_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->replaced_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  if (bVar17 == false) {
    SparseMatrix::push_back(&this->U_,this->dim_ + iVar15,local_88);
    floatfield = (fmtflags)lVar14;
  }
  else {
    iVar11 = uVar7 - 1;
    if ((int)uVar9 < iVar11) {
      pdVar4 = (this->U_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = uVar10 & 0xffffffff;
      lVar14 = 0;
      do {
        piVar2[uVar10 + lVar14] = piVar2[uVar10 + lVar14 + 1];
        pdVar4[uVar10 + lVar14] = pdVar4[uVar10 + lVar14 + 1];
        lVar14 = lVar14 + 1;
      } while ((int)(uVar9 + (int)lVar14) < iVar11);
    }
    floatfield = (fmtflags)lVar14;
    piVar2[iVar11] = this->dim_ + iVar15;
    (this->U_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar11] = local_88;
  }
  piVar3 = (this->U_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar11 = piVar3[(long)this->replace_next_ + 1];
  iVar16 = piVar3[this->replace_next_];
  if (iVar16 < iVar11 + -1) {
    memset((this->U_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + iVar16,0,(ulong)((iVar11 - iVar16) - 2) * 8 + 8);
  }
  (this->U_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[(long)iVar11 + -1] = 1.0;
  SparseMatrix::add_column(&this->U_);
  SparseMatrix::add_column(&this->R_);
  __position._M_current =
       (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->replaced_,__position,&this->replace_next_);
  }
  else {
    *__position._M_current = this->replace_next_;
    (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  this->replace_next_ = -1;
  this->have_btran_ = false;
  this->have_ftran_ = false;
  IVar5 = -1;
  dVar18 = 0.0;
  if ((local_88 != 0.0) || (NAN(local_88))) {
    piVar3 = (this->R_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar11 = piVar3[iVar15];
    lVar14 = (long)iVar11;
    iVar15 = piVar3[(long)iVar15 + 1];
    if (iVar11 < iVar15) {
      dVar18 = 0.0;
      do {
        dVar19 = ABS((this->R_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar14]);
        if (dVar19 <= dVar18) {
          dVar19 = dVar18;
        }
        dVar18 = dVar19;
        lVar14 = lVar14 + 1;
      } while (iVar15 != lVar14);
    }
    if (10000000000.0 < dVar18) {
      uStack_60 = 0;
      local_68 = dVar18;
      poVar6 = Control::Debug(this->control_,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," max eta = ",0xb);
      Format_abi_cxx11_(&local_50,(ipx *)0x0,local_68,2,0x100,floatfield);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_50._M_dataplus._M_p,local_50._M_string_length);
      local_89 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_89,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    local_88 = ABS((local_88 - (local_70 - local_58)) / local_88);
    IVar5 = 0;
    if (1e-08 < local_88) {
      uStack_80 = 0;
      poVar6 = Control::Debug(this->control_,3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6," relative error in new diagonal entry of U = ",0x2d);
      Format_abi_cxx11_(&local_50,(ipx *)0x0,local_88,2,0x100,floatfield);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_50._M_dataplus._M_p,local_50._M_string_length);
      local_89 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_89,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      IVar5 = 1;
    }
  }
  return IVar5;
}

Assistant:

Int ForrestTomlin::_Update(double pivot) {
    Int num_updates = replaced_.size();
    assert(have_ftran_);
    assert(have_btran_);

    // Find the position of the entry with row index replace_next_ in spike.
    // If not present, we will have where == qend.
    assert(replace_next_ >= 0);
    Int qend = U_.queue_size();
    Int where = 0;
    while (where < qend && U_.qindex(where) != replace_next_)
        where++;

    // Compute new diagonal entry of U. newdiag1 will be inserted into U;
    // newdiag2 would be the same in exact arithmetic and is for monitoring
    // numerical stability.
    double olddiag = U_.value(U_.end(replace_next_)-1);
    double newdiag1 = pivot * olddiag;
    double newdiag2 = (where == qend ? 0.0 : U_.qvalue(where)) -
        SparseDot(U_, R_);
    double newdiag_err = std::abs(newdiag1-newdiag2);
    double rel_newdiag_err = newdiag_err / std::abs(newdiag1);

    // Put new diagonal entry at end of spike.
    if (where < qend) {
        for (Int l = where; l < qend-1; l++) {
            U_.qindex(l) = U_.qindex(l+1);
            U_.qvalue(l) = U_.qvalue(l+1);
        }
        U_.qindex(qend-1) = dim_+num_updates;
        U_.qvalue(qend-1) = newdiag1;
    } else {
        U_.push_back(dim_+num_updates, newdiag1);
    }

    // Overwrite replaced column by unit column in U.
    Int end = U_.end(replace_next_);
    for (Int l = U_.begin(replace_next_); l < end-1; l++)
        U_.value(l) = 0.0;
    U_.value(end-1) = 1.0;

    // Finish update.
    U_.add_column();
    R_.add_column();
    replaced_.push_back(replace_next_);
    replace_next_ = -1;
    have_btran_ = false;
    have_ftran_ = false;

    if (newdiag1 == 0.0)
        return -1;

    // Print a debugging message if a new eta entry is large.
    double max_eta = 0.0;
    for (Int l = R_.begin(num_updates); l < R_.end(num_updates); l++)
        max_eta = std::max(max_eta, std::abs(R_.value(l)));
    if (max_eta > 1e10)
        control_.Debug(3) << " max eta = " << sci2(max_eta) << '\n';

    // stability check
    if (rel_newdiag_err > kFtDiagErrorTol) {
        control_.Debug(3)
            << " relative error in new diagonal entry of U = "
            << sci2(rel_newdiag_err) << '\n';
        return 1;
    }
    return 0;
}